

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cc
# Opt level: O3

Status * __thiscall
draco::Encoder::EncodeMeshToBuffer
          (Status *__return_storage_ptr__,Encoder *this,Mesh *m,EncoderBuffer *out_buffer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  ExpertEncoder encoder;
  EncoderOptions EStack_168;
  ExpertEncoder local_d8;
  
  ExpertEncoder::ExpertEncoder(&local_d8,m);
  CreateExpertEncoderOptions(&EStack_168,this,&m->super_PointCloud);
  ExpertEncoder::Reset(&local_d8,&EStack_168);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&EStack_168.feature_options_);
  std::
  _Rb_tree<int,_std::pair<const_int,_draco::Options>,_std::_Select1st<std::pair<const_int,_draco::Options>_>,_std::less<int>,_std::allocator<std::pair<const_int,_draco::Options>_>_>
  ::~_Rb_tree(&EStack_168.super_DracoOptions<int>.attribute_options_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&EStack_168);
  ExpertEncoder::EncodeToBuffer(__return_storage_ptr__,&local_d8,out_buffer);
  if (__return_storage_ptr__->code_ == OK) {
    pcVar2 = (__return_storage_ptr__->error_msg_)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->error_msg_).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    (this->super_EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>).
    num_encoded_points_ =
         local_d8.super_EncoderBase<draco::EncoderOptionsBase<int>_>.num_encoded_points_;
    (this->super_EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>).
    num_encoded_faces_ =
         local_d8.super_EncoderBase<draco::EncoderOptionsBase<int>_>.num_encoded_faces_;
    __return_storage_ptr__->code_ = OK;
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p = (pointer)paVar1;
    (__return_storage_ptr__->error_msg_)._M_string_length = 0;
    (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
  }
  EncoderBase<draco::EncoderOptionsBase<int>_>::~EncoderBase
            (&local_d8.super_EncoderBase<draco::EncoderOptionsBase<int>_>);
  return __return_storage_ptr__;
}

Assistant:

Status Encoder::EncodeMeshToBuffer(const Mesh &m, EncoderBuffer *out_buffer) {
  ExpertEncoder encoder(m);
  encoder.Reset(CreateExpertEncoderOptions(m));
  DRACO_RETURN_IF_ERROR(encoder.EncodeToBuffer(out_buffer));
  set_num_encoded_points(encoder.num_encoded_points());
  set_num_encoded_faces(encoder.num_encoded_faces());
  return OkStatus();
}